

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

HalfedgeHandle __thiscall
OpenMesh::PolyConnectivity::insert_edge
          (PolyConnectivity *this,HalfedgeHandle _prev_heh,HalfedgeHandle _next_heh)

{
  bool bVar1;
  VertexHandle _start_vh;
  VertexHandle _end_vh;
  BaseHandle _nheh;
  HalfedgeHandle HVar2;
  HalfedgeHandle _heh;
  bool local_f1;
  BaseHandle local_d0;
  BaseHandle local_cc;
  BaseHandle local_c8;
  BaseHandle local_c4;
  BaseHandle local_c0;
  BaseHandle local_bc;
  FaceHandle old_fh;
  undefined1 local_b0 [8];
  FaceHalfedgeIter fh_it;
  BaseHandle local_8c;
  BaseHandle local_88;
  FaceHandle new_fh;
  HalfedgeHandle prev_next_heh;
  HalfedgeHandle next_prev_heh;
  HalfedgeHandle heh1;
  VertexHandle vh1;
  VertexHandle vh0;
  BaseHandle local_2c;
  BaseHandle local_28;
  BaseHandle local_24;
  PolyConnectivity *local_20;
  PolyConnectivity *this_local;
  BaseHandle local_10;
  HalfedgeHandle _next_heh_local;
  HalfedgeHandle _prev_heh_local;
  HalfedgeHandle heh0;
  
  local_28 = _prev_heh.super_BaseHandle.idx_;
  local_20 = this;
  this_local._4_4_ = _next_heh.super_BaseHandle.idx_;
  local_10 = _prev_heh.super_BaseHandle.idx_;
  local_24.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,_prev_heh);
  local_2c.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,this_local._4_4_);
  bVar1 = BaseHandle::operator==(&local_24,&local_2c);
  if (!bVar1) {
    __assert_fail("face_handle(_prev_heh) == face_handle(_next_heh)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x3d2,
                  "PolyConnectivity::HalfedgeHandle OpenMesh::PolyConnectivity::insert_edge(HalfedgeHandle, HalfedgeHandle)"
                 );
  }
  vh0.super_BaseHandle.idx_ =
       (BaseHandle)
       ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_10.idx_);
  bVar1 = BaseHandle::operator!=(&vh0.super_BaseHandle,(BaseHandle *)((long)&this_local + 4));
  if (bVar1) {
    _start_vh = ArrayKernel::to_vertex_handle
                          (&this->super_ArrayKernel,(HalfedgeHandle)local_10.idx_);
    _end_vh = ArrayKernel::from_vertex_handle
                        (&this->super_ArrayKernel,(HalfedgeHandle)this_local._4_4_);
    _next_heh_local = ArrayKernel::new_edge(&this->super_ArrayKernel,_start_vh,_end_vh);
    _nheh.idx_ = (int)ArrayKernel::opposite_halfedge_handle
                                (&this->super_ArrayKernel,_next_heh_local);
    HVar2 = ArrayKernel::next_halfedge_handle
                      (&this->super_ArrayKernel,(HalfedgeHandle)local_10.idx_);
    _heh = ArrayKernel::prev_halfedge_handle
                     (&this->super_ArrayKernel,(HalfedgeHandle)this_local._4_4_);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)local_10.idx_,_next_heh_local);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,_next_heh_local,(HalfedgeHandle)this_local._4_4_);
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,(HalfedgeHandle)_nheh.idx_);
    local_88 = HVar2.super_BaseHandle.idx_;
    new_fh.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)_nheh.idx_;
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)_nheh.idx_,HVar2)
    ;
    local_8c.idx_ = (int)ArrayKernel::new_face(&this->super_ArrayKernel);
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
         _next_heh_local.super_BaseHandle.idx_;
    ArrayKernel::set_halfedge_handle
              (&this->super_ArrayKernel,(FaceHandle)local_8c.idx_,_next_heh_local);
    fh_iter((FaceHalfedgeIter *)local_b0,this,(FaceHandle)local_8c.idx_);
    while (bVar1 = Iterators::
                   GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                   ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                               *)local_b0), bVar1) {
      old_fh.super_BaseHandle.idx_ =
           (BaseHandle)
           Iterators::
           GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
           ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                        *)local_b0);
      local_bc.idx_ = local_8c.idx_;
      ArrayKernel::set_face_handle
                (&this->super_ArrayKernel,(HalfedgeHandle)old_fh.super_BaseHandle.idx_,
                 (FaceHandle)local_8c.idx_);
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_b0);
    }
    local_c4 = HVar2.super_BaseHandle.idx_;
    local_cc.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,HVar2);
    local_c8.idx_ = _nheh.idx_;
    local_c0.idx_ = local_cc.idx_;
    ArrayKernel::set_face_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)_nheh.idx_,(FaceHandle)local_cc.idx_);
    bVar1 = BaseHandle::is_valid(&local_c0);
    local_f1 = false;
    if (bVar1) {
      HVar2 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,(FaceHandle)local_c0.idx_);
      local_d0.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,HVar2);
      local_f1 = BaseHandle::operator==(&local_d0,&local_8c);
    }
    if (local_f1 != false) {
      ArrayKernel::set_halfedge_handle
                (&this->super_ArrayKernel,(FaceHandle)local_c0.idx_,(HalfedgeHandle)_nheh.idx_);
    }
    adjust_outgoing_halfedge(this,_start_vh);
    adjust_outgoing_halfedge(this,_end_vh);
    return (HalfedgeHandle)_next_heh_local.super_BaseHandle;
  }
  __assert_fail("next_halfedge_handle(_prev_heh) != _next_heh",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                ,0x3d3,
                "PolyConnectivity::HalfedgeHandle OpenMesh::PolyConnectivity::insert_edge(HalfedgeHandle, HalfedgeHandle)"
               );
}

Assistant:

PolyConnectivity::HalfedgeHandle
PolyConnectivity::insert_edge(HalfedgeHandle _prev_heh, HalfedgeHandle _next_heh)
{
  assert(face_handle(_prev_heh) == face_handle(_next_heh));//only the manifold case
  assert(next_halfedge_handle(_prev_heh) != _next_heh);//this can not be done
  VertexHandle vh0 = to_vertex_handle(_prev_heh);
  VertexHandle vh1 = from_vertex_handle(_next_heh);
  //create the link between vh0 and vh1
  HalfedgeHandle heh0 = new_edge(vh0, vh1);
  HalfedgeHandle heh1 = opposite_halfedge_handle(heh0);
  HalfedgeHandle next_prev_heh = next_halfedge_handle(_prev_heh);
  HalfedgeHandle prev_next_heh = prev_halfedge_handle(_next_heh);
  set_next_halfedge_handle(_prev_heh, heh0);
  set_next_halfedge_handle(heh0, _next_heh);
  set_next_halfedge_handle(prev_next_heh, heh1);
  set_next_halfedge_handle(heh1, next_prev_heh);
  
  //now set the face handles - the new face is assigned to heh0
  FaceHandle new_fh = new_face();
  set_halfedge_handle(new_fh, heh0);
  for (FaceHalfedgeIter fh_it = fh_iter(new_fh); fh_it.is_valid(); ++fh_it)
  {
    set_face_handle(*fh_it, new_fh);
  }  
  FaceHandle old_fh = face_handle(next_prev_heh);
  set_face_handle(heh1, old_fh);   
  if (old_fh.is_valid() && face_handle(halfedge_handle(old_fh)) == new_fh)
  {//fh pointed to one of the halfedges now assigned to new_fh
    set_halfedge_handle(old_fh, heh1);
  }
  adjust_outgoing_halfedge(vh0);  
  adjust_outgoing_halfedge(vh1);  
  return heh0;
}